

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall cmStateDirectory::SetCurrentBinary(cmStateDirectory *this,string *dir)

{
  PointerType pBVar1;
  allocator local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *loc;
  string *dir_local;
  cmStateDirectory *this_local;
  
  loc = dir;
  dir_local = (string *)this;
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  local_20 = &pBVar1->OutputLocation;
  std::__cxx11::string::operator=((string *)local_20,(string *)loc);
  cmsys::SystemTools::ConvertToUnixSlashes(local_20);
  cmsys::SystemTools::CollapseFullPath(&local_40,local_20);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ComputeRelativePathTopBinary(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_CURRENT_BINARY_DIR",&local_61);
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_60,local_20);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void cmStateDirectory::SetCurrentBinary(std::string const& dir)
{
  std::string& loc = this->DirectoryState->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  this->ComputeRelativePathTopBinary();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_BINARY_DIR", loc);
}